

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void * Curl_hash_pick(curl_hash *h,void *key,size_t key_len)

{
  curl_llist_element *pcVar1;
  size_t sVar2;
  void *pvVar3;
  curl_llist *pcVar4;
  
  if (h == (curl_hash *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pcVar4 = h->table;
    sVar2 = (*h->hash_func)(key,key_len,(long)h->slots);
    pcVar4 = pcVar4 + sVar2;
    do {
      pcVar1 = pcVar4->head;
      if (pcVar1 == (curl_llist_element *)0x0) {
        return (void *)0x0;
      }
      pvVar3 = pcVar1->ptr;
      sVar2 = (*h->comp_func)((void *)((long)pvVar3 + 0x28),*(size_t *)((long)pvVar3 + 0x20),key,
                              key_len);
      pcVar4 = (curl_llist *)&pcVar1->next;
    } while (sVar2 == 0);
    pvVar3 = *(void **)((long)pvVar3 + 0x18);
  }
  return pvVar3;
}

Assistant:

void *
Curl_hash_pick(struct curl_hash *h, void *key, size_t key_len)
{
  struct curl_llist_element *le;
  struct curl_llist *l;

  if(h) {
    l = FETCH_LIST(h, key, key_len);
    for(le = l->head; le; le = le->next) {
      struct curl_hash_element *he = le->ptr;
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
    }
  }

  return NULL;
}